

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O3

void printbits2(uint8_t *k,int nbytes)

{
  byte bVar1;
  int j;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = (ulong)(uint)nbytes;
  putchar(0x5b);
  if (0 < nbytes) {
    do {
      bVar1 = k[uVar3 - 1];
      uVar2 = 7;
      do {
        putc((uint)((bVar1 >> (uVar2 & 0x1f) & 1) != 0) * 3 + 0x20,_stdout);
        bVar4 = uVar2 != 0;
        uVar2 = uVar2 - 1;
      } while (bVar4);
      bVar4 = 1 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar4);
  }
  putchar(0x5d);
  return;
}

Assistant:

void printbits2 ( const uint8_t * k, int nbytes )
{
  printf("[");

  for(int i = nbytes-1; i >= 0; i--)
  {
    uint8_t b = k[i];

    for(int j = 7; j >= 0; j--)
    {
      uint8_t c = (b & (1 << j)) ? '#' : ' ';

      putc(c,stdout);
    }
  }
  printf("]");
}